

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O0

bool __thiscall
despot::util::tinyxml::TiXmlDocument::Accept(TiXmlDocument *this,TiXmlVisitor *visitor)

{
  byte bVar1;
  uint uVar2;
  ulong uVar3;
  TiXmlNode *local_20;
  TiXmlNode *node;
  TiXmlVisitor *visitor_local;
  TiXmlDocument *this_local;
  
  uVar3 = (**(code **)(*(long *)visitor + 0x10))();
  if ((uVar3 & 1) != 0) {
    local_20 = TiXmlNode::FirstChild(&this->super_TiXmlNode);
    while ((local_20 != (TiXmlNode *)0x0 &&
           (uVar2 = (*(local_20->super_TiXmlBase)._vptr_TiXmlBase[0x11])(local_20,visitor),
           (uVar2 & 1) != 0))) {
      local_20 = TiXmlNode::NextSibling(local_20);
    }
  }
  bVar1 = (**(code **)(*(long *)visitor + 0x18))(visitor,this);
  return (bool)(bVar1 & 1);
}

Assistant:

bool TiXmlDocument::Accept(TiXmlVisitor* visitor) const {
	if (visitor->VisitEnter(*this)) {
		for (const TiXmlNode* node = FirstChild(); node;
			node = node->NextSibling()) {
			if (!node->Accept(visitor))
				break;
		}
	}
	return visitor->VisitExit(*this);
}